

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                     *that)

{
  char *pcVar1;
  map_slot_type<int,_phmap::priv::(anonymous_namespace)::balast> *pmVar2;
  unsigned_long uVar3;
  size_t *psVar4;
  HashtablezInfoHandle local_31;
  int local_30 [2];
  void *local_28;
  ctrl_t *local_20;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *local_18;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *that_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_local;
  
  local_18 = that;
  that_local = this;
  local_20 = EmptyGroup<std::is_same<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>>
                       ();
  pcVar1 = exchange<signed_char*,signed_char*>(&that->ctrl_,&local_20);
  this->ctrl_ = pcVar1;
  local_28 = (void *)0x0;
  pmVar2 = exchange<phmap::priv::map_slot_type<int,phmap::priv::(anonymous_namespace)::balast>*,decltype(nullptr)>
                     (&local_18->slots_,&local_28);
  this->slots_ = pmVar2;
  local_30[1] = 0;
  uVar3 = exchange<unsigned_long,int>(&local_18->size_,local_30 + 1);
  this->size_ = uVar3;
  local_30[0] = 0;
  uVar3 = exchange<unsigned_long,int>(&local_18->capacity_,local_30);
  this->capacity_ = uVar3;
  exchange<phmap::priv::HashtablezInfoHandle,phmap::priv::HashtablezInfoHandle>
            ((HashtablezInfoHandle *)&local_18->field_0x20,&local_31);
  std::
  tuple<unsigned_long,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  ::tuple(&this->settings_,&local_18->settings_);
  psVar4 = growth_left(local_18);
  *psVar4 = 0;
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that) noexcept(
        std::is_nothrow_copy_constructible<hasher>::value&&
        std::is_nothrow_copy_constructible<key_equal>::value&&
        std::is_nothrow_copy_constructible<allocator_type>::value)
        : ctrl_(phmap::exchange(that.ctrl_, EmptyGroup<std_alloc_t>())),
        slots_(phmap::exchange(that.slots_, nullptr)),
        size_(phmap::exchange(that.size_, 0)),
        capacity_(phmap::exchange(that.capacity_, 0)),
        infoz_(phmap::exchange(that.infoz_, HashtablezInfoHandle())),
        // Hash, equality and allocator are copied instead of moved because
        // `that` must be left valid. If Hash is std::function<Key>, moving it
        // would create a nullptr functor that cannot be called.
        settings_(std::move(that.settings_)) {
        // growth_left was copied above, reset the one from `that`.
        that.growth_left() = 0;
    }